

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O2

Ast __thiscall
lambda::anon_unknown_1::reduce_rec(anon_unknown_1 *this,Parse_ast *ast,Context *context)

{
  __index_type _Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Ast AVar2;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  
  _Var1 = *(__index_type *)
           ((long)&(ast->underlying_).
                   super__Variant_base<lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                   .
                   super__Move_assign_alias<lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                   .
                   super__Copy_assign_alias<lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                   .
                   super__Move_ctor_alias<lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                   .
                   super__Copy_ctor_alias<lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                   .
                   super__Variant_storage_alias<lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
           + 0x28);
  local_28 = context;
  local_20 = context;
  local_18 = context;
  if (_Var1 == 0xff) {
    std::__throw_bad_variant_access("std::visit: variant is valueless");
    _Var1 = *(__index_type *)
             ((long)&(ast->underlying_).
                     super__Variant_base<lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                     .
                     super__Move_assign_alias<lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                     .
                     super__Copy_assign_alias<lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                     .
                     super__Move_ctor_alias<lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                     .
                     super__Copy_ctor_alias<lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                     .
                     super__Variant_storage_alias<lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
             + 0x28);
  }
  (*std::__detail::__variant::
    __gen_vtable<std::__detail::__variant::__deduce_visit_result<lambda::Ast>,_ublib::impl::Overload<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/strega-nil[P]lambda/source/lambda/ast.cpp:41:9),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/strega-nil[P]lambda/source/lambda/ast.cpp:48:9),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/strega-nil[P]lambda/source/lambda/ast.cpp:53:9)>_&&,_const_std::variant<lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>_&>
    ::_S_vtable._M_arr[(char)_Var1]._M_data)
            ((Overload<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_strega_nil[P]lambda_source_lambda_ast_cpp:41:9),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_strega_nil[P]lambda_source_lambda_ast_cpp:48:9),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_strega_nil[P]lambda_source_lambda_ast_cpp:53:9)>
              *)this,(variant<lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                      *)&stack0xffffffffffffffd8);
  AVar2.underlying_.
  super___shared_ptr<const_std::variant<lambda::Ast::Variable,_lambda::Ast::Free_variable,_lambda::Ast::Call,_lambda::Ast::Lambda>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  AVar2.underlying_.
  super___shared_ptr<const_std::variant<lambda::Ast::Variable,_lambda::Ast::Free_variable,_lambda::Ast::Call,_lambda::Ast::Lambda>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (Ast)AVar2.underlying_.
              super___shared_ptr<const_std::variant<lambda::Ast::Variable,_lambda::Ast::Free_variable,_lambda::Ast::Call,_lambda::Ast::Lambda>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

Ast reduce_rec(Parse_ast const& ast, Context& context) {
    return ublib::match(ast)(
        [&](Parse_ast::Variable const& e) {
          if (auto idx = find_in_context(context, e.name())) {
            return Ast(Ast::Variable(*idx));
          } else {
            return Ast(Ast::Free_variable(e.name()));
          }
        },
        [&](Parse_ast::Call const& e) {
          auto arg = reduce_rec(e.argument(), context);
          auto callee = reduce_rec(e.callee(), context);
          return Ast(Ast::Call(std::move(callee), std::move(arg)));
        },
        [&](Parse_ast::Lambda const& e) {
          context.push_back(e.parameter());
          auto typed = reduce_rec(e.expression(), context);
          context.pop_back();
          return Ast(Ast::Lambda(e.parameter(), std::move(typed)));
        });
  }